

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O0

void __thiscall
CorruptInternalNodes_ChildClaimsToBeOnHeap_Test::TestBody
          (CorruptInternalNodes_ChildClaimsToBeOnHeap_Test *this)

{
  pointer this_00;
  index_pointer node;
  element_type *this_01;
  internal_node *p;
  address local_a8;
  index_pointer local_a0;
  index_pointer *local_98;
  index_pointer *first;
  undefined1 local_88 [8];
  shared_ptr<pstore::index::details::internal_node> inode;
  index_pointer root;
  unique_lock<mock_mutex> local_58;
  undefined1 local_48 [8];
  transaction_type t1;
  CorruptInternalNodes_ChildClaimsToBeOnHeap_Test *this_local;
  
  t1.lock_._8_8_ = this;
  std::unique_lock<mock_mutex>::unique_lock
            (&local_58,
             (mutex_type *)
             &(this->super_CorruptInternalNodes).super_GenericIndexFixture.super_IndexFixture.
              field_0x10);
  ::begin((transaction<std::unique_lock<mock_mutex>_> *)local_48,
          &(this->super_CorruptInternalNodes).super_GenericIndexFixture.super_IndexFixture.db_,
          &local_58);
  std::unique_lock<mock_mutex>::~unique_lock(&local_58);
  anon_unknown.dwarf_10ddcf::CorruptInternalNodes::build
            (&this->super_CorruptInternalNodes,(transaction_type *)local_48);
  this_00 = std::
            unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator->(&(this->super_CorruptInternalNodes).index_);
  node = pstore::index::
         hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::root(this_00);
  inode.super___shared_ptr<pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)node;
  anon_unknown.dwarf_10ddcf::GenericIndexFixture::check_is_store_internal_node
            ((GenericIndexFixture *)this,node);
  first = (index_pointer *)node;
  anon_unknown.dwarf_10ddcf::CorruptInternalNodes::load_inode
            ((CorruptInternalNodes *)local_88,(index_pointer)this);
  this_01 = std::
            __shared_ptr_access<pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator*((__shared_ptr_access<pstore::index::details::internal_node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
  local_98 = pstore::index::details::internal_node::operator[](this_01,0);
  local_a8 = pstore::index::details::index_pointer::to_address((index_pointer *)&local_98->addr_);
  p = (internal_node *)pstore::address::absolute(&local_a8);
  pstore::index::details::index_pointer::index_pointer((index_pointer *)&local_a0.addr_,p);
  *local_98 = local_a0;
  std::shared_ptr<pstore::index::details::internal_node>::~shared_ptr
            ((shared_ptr<pstore::index::details::internal_node> *)local_88);
  pstore::transaction_base::commit((transaction_base *)local_48);
  pstore::transaction<std::unique_lock<mock_mutex>_>::~transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_48);
  anon_unknown.dwarf_10ddcf::CorruptInternalNodes::iterate(&this->super_CorruptInternalNodes);
  anon_unknown.dwarf_10ddcf::CorruptInternalNodes::find(&this->super_CorruptInternalNodes);
  return;
}

Assistant:

TEST_F (CorruptInternalNodes, ChildClaimsToBeOnHeap) {
    {
        transaction_type t1 = begin (db_, lock_guard{mutex_});
        this->build (t1);

        index_pointer root = index_->root ();
        this->check_is_store_internal_node (root);

        // Corrupt the first child field such it claims to be on the heap.
        {
            std::shared_ptr<internal_node> inode = this->load_inode (root);
            index_pointer & first = (*inode)[0];
            first =
                index_pointer{reinterpret_cast<internal_node *> (first.to_address ().absolute ())};
        }
        t1.commit ();
    }
    this->iterate ();
    this->find ();
}